

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

void av1_search_palette_mode_luma
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint ref_frame_cost,
               PICK_MODE_CONTEXT *ctx,RD_STATS *this_rd_cost,int64_t best_rd)

{
  long lVar1;
  int iVar2;
  void *__dest;
  int in_ECX;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long in_R8;
  int *in_R9;
  RD_STATS rd_stats_y;
  int cols;
  int rows;
  int *intra_mode_cost;
  ModeCosts *mode_costs;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  MB_MODE_INFO best_mbmi_palette;
  uint8_t *color_map;
  uint8_t *best_palette_color_map;
  int64_t this_rd;
  int64_t best_rd_palette;
  MACROBLOCKD *xd;
  PALETTE_MODE_INFO *pmi;
  MB_MODE_INFO *mbmi;
  uint8_t *in_stack_00003ee0;
  MB_MODE_INFO *in_stack_00003ee8;
  int in_stack_00003ef0;
  BLOCK_SIZE in_stack_00003ef7;
  MACROBLOCK *in_stack_00003ef8;
  AV1_COMP *in_stack_00003f00;
  int64_t *in_stack_00003f40;
  int *in_stack_00003f48;
  int *in_stack_00003f50;
  int64_t *in_stack_00003f58;
  uint8_t *in_stack_00003f60;
  int *in_stack_00003f68;
  PICK_MODE_CONTEXT *in_stack_00003f70;
  uint8_t *in_stack_00003f78;
  uint8_t *in_stack_00003f80;
  RD_STATS local_988;
  uint local_960;
  uint local_95c;
  long local_958;
  long local_950;
  undefined1 local_948 [1024];
  undefined1 local_548 [1032];
  undefined1 local_140 [176];
  void *local_90;
  void *local_88;
  MACROBLOCKD *local_70;
  long local_68;
  void *local_60;
  int *local_58;
  long local_50;
  int local_48;
  BLOCK_SIZE local_41;
  long local_40;
  
  local_60 = (void *)**(undefined8 **)(in_RSI + 0x2058);
  local_68 = (long)local_60 + 0x5e;
  local_70 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_88 = *(void **)(in_RSI + 0x41c0);
  local_90 = *(void **)(in_RSI + 0x250);
  local_58 = in_R9;
  local_50 = in_R8;
  local_48 = in_ECX;
  local_41 = in_DL;
  local_40 = in_RSI;
  memcpy(local_140,local_60,0xb0);
  local_950 = local_40 + 0x4230;
  local_958 = local_40 + 0x4550 + (ulong)""[local_41] * 0x34;
  local_95c = (uint)block_size_high[local_41];
  local_960 = (uint)block_size_wide[local_41];
  *(undefined1 *)((long)local_60 + 2) = 0;
  *(undefined1 *)((long)local_60 + 3) = 0;
  *(undefined1 *)((long)local_60 + 0x10) = 0;
  *(undefined1 *)((long)local_60 + 0x11) = 0xff;
  memset((void *)(local_68 + 0x30),0,2);
  av1_invalid_rd_stats(&local_988);
  av1_rd_pick_palette_intra_sby
            (in_stack_00003f00,in_stack_00003ef8,in_stack_00003ef7,in_stack_00003ef0,
             in_stack_00003ee8,in_stack_00003ee0,in_stack_00003f40,in_stack_00003f48,
             in_stack_00003f50,in_stack_00003f58,in_stack_00003f60,in_stack_00003f68,
             in_stack_00003f70,in_stack_00003f78,in_stack_00003f80);
  if ((local_988.rate == 0x7fffffff) || (*(char *)(local_68 + 0x30) == '\0')) {
    local_58[4] = -1;
    local_58[5] = 0x7fffffff;
  }
  else {
    __dest = (void *)(local_40 + 0x24e09);
    iVar2 = bsize_to_num_blk(local_41);
    memcpy(__dest,local_548,(long)iVar2);
    memcpy(local_70->tx_type_map,local_948,(long)*(int *)(local_50 + 0x1a0));
    memcpy(local_90,local_88,(long)(int)(local_95c * local_960));
    lVar1 = local_950;
    local_988.rate = local_48 + local_988.rate;
    if (local_988.skip_txfm == '\0') {
      iVar2 = av1_get_skip_txfm_context(local_70);
      local_988.rate = *(int *)(lVar1 + 0x4a50 + (long)iVar2 * 8) + local_988.rate;
    }
    else {
      iVar2 = av1_get_skip_txfm_context(local_70);
      local_988.rate = local_48 + *(int *)(lVar1 + 0x4a54 + (long)iVar2 * 8);
    }
    iVar2 = *(int *)(local_40 + 0x4218);
    *local_58 = local_988.rate;
    *(int64_t *)(local_58 + 2) = local_988.dist;
    *(long *)(local_58 + 4) =
         ((long)local_988.rate * (long)iVar2 + 0x100 >> 9) + local_988.dist * 0x80;
    *(uint8_t *)(local_58 + 8) = local_988.skip_txfm;
  }
  return;
}

Assistant:

void av1_search_palette_mode_luma(const AV1_COMP *cpi, MACROBLOCK *x,
                                  BLOCK_SIZE bsize, unsigned int ref_frame_cost,
                                  PICK_MODE_CONTEXT *ctx,
                                  RD_STATS *this_rd_cost, int64_t best_rd) {
  MB_MODE_INFO *const mbmi = x->e_mbd.mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  MACROBLOCKD *const xd = &x->e_mbd;
  int64_t best_rd_palette = best_rd, this_rd;
  uint8_t *const best_palette_color_map =
      x->palette_buffer->best_palette_color_map;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  MB_MODE_INFO best_mbmi_palette = *mbmi;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *const intra_mode_cost =
      mode_costs->mbmode_cost[size_group_lookup[bsize]];
  const int rows = block_size_high[bsize];
  const int cols = block_size_wide[bsize];

  mbmi->mode = DC_PRED;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  av1_zero(pmi->palette_size);

  RD_STATS rd_stats_y;
  av1_invalid_rd_stats(&rd_stats_y);
  av1_rd_pick_palette_intra_sby(cpi, x, bsize, intra_mode_cost[DC_PRED],
                                &best_mbmi_palette, best_palette_color_map,
                                &best_rd_palette, &rd_stats_y.rate, NULL,
                                &rd_stats_y.dist, &rd_stats_y.skip_txfm, NULL,
                                ctx, best_blk_skip, best_tx_type_map);
  if (rd_stats_y.rate == INT_MAX || pmi->palette_size[0] == 0) {
    this_rd_cost->rdcost = INT64_MAX;
    return;
  }

  memcpy(x->txfm_search_info.blk_skip, best_blk_skip,
         sizeof(best_blk_skip[0]) * bsize_to_num_blk(bsize));
  av1_copy_array(xd->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
  memcpy(color_map, best_palette_color_map,
         rows * cols * sizeof(best_palette_color_map[0]));

  rd_stats_y.rate += ref_frame_cost;

  if (rd_stats_y.skip_txfm) {
    rd_stats_y.rate =
        ref_frame_cost +
        mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][1];
  } else {
    rd_stats_y.rate +=
        mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
  }
  this_rd = RDCOST(x->rdmult, rd_stats_y.rate, rd_stats_y.dist);
  this_rd_cost->rate = rd_stats_y.rate;
  this_rd_cost->dist = rd_stats_y.dist;
  this_rd_cost->rdcost = this_rd;
  this_rd_cost->skip_txfm = rd_stats_y.skip_txfm;
}